

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

address __thiscall
pstore::index::details::linear_node::flush(linear_node *this,transaction_base *transaction)

{
  pair<std::shared_ptr<void>,_pstore::address> local_30;
  
  transaction_base::alloc_rw(&local_30,transaction,this->size_ * 8 + 0x10,8);
  if ((linear_node *)local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (linear_node *)0x0) {
    linear_node((linear_node *)
                local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
  }
  if (local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return (address)local_30.second.a_;
}

Assistant:

address linear_node::flush (transaction_base & transaction) const {
                std::size_t const num_bytes = this->size_bytes ();

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (linear_node));
                new (ptr.get ()) linear_node (*this);
                return result;
            }